

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

void predict_or_learn_multi<false,false>(nn *n,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  polylabel *ppVar2;
  polylabel *ppVar3;
  features *pfVar4;
  bool *pbVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  shared_data *psVar10;
  _func_void_shared_data_ptr_float *p_Var11;
  loss_function *plVar12;
  bool *pbVar13;
  polyprediction *ppVar14;
  shared_data *psVar15;
  uint64_t uVar16;
  _func_void_int_string_v_array<char> *p_Var17;
  label_t lVar18;
  wclass *pwVar19;
  size_t sVar20;
  v_array<char> vVar21;
  byte bVar22;
  uint i_2;
  uint64_t uVar23;
  ostream *poVar24;
  long lVar25;
  long lVar26;
  features *pfVar27;
  features *pfVar28;
  uint i;
  vw *all;
  ulong uVar29;
  polyprediction *ppVar30;
  byte bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined8 in_stack_fffffffffffffc58;
  example *peVar36;
  example *ec_00;
  float fVar37;
  float fVar38;
  int iVar39;
  string local_310 [32];
  ostringstream outputStringStream;
  shared_data sd;
  features save_nn_output_namespace;
  
  bVar31 = 0;
  all = n->all;
  iVar39 = all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,all);
    all = n->all;
  }
  memcpy(&sd,all->sd,0xe0);
  psVar10 = all->sd;
  all->sd = &sd;
  if (n->dropout == false) {
    fVar32 = 1.0;
  }
  else {
    fVar32 = 2.0;
  }
  fVar6 = (ec->l).simple.label;
  p_Var11 = n->all->set_minmax;
  plVar12 = n->all->loss;
  pbVar13 = n->dropped_out;
  ppVar14 = n->hidden_units_pred;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStringStream);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar15 = n->all->sd;
  fVar38 = psVar15->min_label;
  psVar15->min_label = -3.0;
  psVar15 = n->all->sd;
  fVar37 = psVar15->max_label;
  psVar15->max_label = 3.0;
  uVar16 = (ec->super_example_predict).ft_offset;
  uVar23 = uVar16;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar23 = 0;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar23;
  if (0 < iVar39) {
    ppVar30 = ppVar14;
    for (uVar29 = 0; uVar29 < n->k; uVar29 = uVar29 + 1) {
      if (uVar29 != 0) {
        std::operator<<((ostream *)&outputStringStream,' ');
      }
      poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)&outputStringStream);
      poVar24 = std::operator<<(poVar24,':');
      poVar24 = (ostream *)std::ostream::operator<<(poVar24,ppVar30->scalar);
      poVar24 = std::operator<<(poVar24,',');
      fVar33 = fasttanh(ppVar30->scalar);
      std::ostream::operator<<(poVar24,fVar33);
      ppVar30 = ppVar30 + 1;
    }
  }
  ppVar2 = &ec->l;
  n->all->loss = plVar12;
  n->all->set_minmax = p_Var11;
  n->all->sd->min_label = fVar38;
  n->all->sd->max_label = fVar37;
  (ec->super_example_predict).ft_offset = uVar16;
  ppVar3 = &(n->output_layer).l;
  pfVar4 = (ec->super_example_predict).feature_space + 0x81;
  bVar22 = 1;
  fVar37 = 0.0;
  fVar38 = 0.0;
  fVar33 = 0.0;
  ec_00 = ec;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar15 = n->all->sd;
    fVar35 = psVar15->min_label;
    psVar15->min_label = -1.0;
    psVar15 = n->all->sd;
    fVar7 = psVar15->max_label;
    psVar15->max_label = 1.0;
    ppVar30 = ppVar14;
    for (uVar29 = 0; uVar29 < n->k; uVar29 = uVar29 + 1) {
      fVar34 = 0.0;
      if (pbVar13[uVar29] == false) {
        fVar34 = fasttanh(ppVar30->scalar);
        fVar34 = fVar34 * fVar32;
      }
      (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar29] = fVar34;
      (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar34 * fVar34;
      (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
           fVar34 * fVar34 + (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq
      ;
      *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
           (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar29];
      LEARNER::learner<char,_example>::predict(base,&n->outputweight,(ulong)n->k);
      fVar34 = (n->outputweight).pred.scalar;
      if ((fVar34 == 0.0) && (!NAN(fVar34))) {
        uVar8 = n->k;
        fVar34 = merand48(&n->all->random_state);
        (n->outputweight).l.simple.label = (fVar34 + -0.5) / SQRT((float)uVar8);
        LEARNER::learner<char,_example>::update(base,&n->outputweight,(ulong)n->k);
        (n->outputweight).l.multi.label = 0x7f7fffff;
      }
      ppVar30 = ppVar30 + 1;
    }
    n->all->loss = plVar12;
    n->all->set_minmax = p_Var11;
    n->all->sd->min_label = fVar35;
    n->all->sd->max_label = fVar7;
    if (n->inpass == false) {
      (n->output_layer).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
      lVar18 = ppVar2->multi;
      pwVar19 = (ec->l).cs.costs._end;
      sVar20 = (ec->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (ec->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar20;
      ppVar3->multi = lVar18;
      (n->output_layer).l.cs.costs._end = pwVar19;
      (n->output_layer).weight = ec_00->weight;
      (n->output_layer).partial_prediction = 0.0;
      LEARNER::learner<char,_example>::predict(base,&n->output_layer,(ulong)n->k);
      (ec->l).cb_eval.event.costs.erase_count = (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar18 = ppVar3->multi;
      pwVar19 = (n->output_layer).l.cs.costs._end;
      sVar20 = (n->output_layer).l.cs.costs.erase_count;
      (ec->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (ec->l).cs.costs.erase_count = sVar20;
      ppVar2->multi = lVar18;
      (ec->l).cs.costs._end = pwVar19;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec_00,&nn_output_namespace);
      pfVar27 = pfVar4;
      pfVar28 = &save_nn_output_namespace;
      for (lVar25 = 0xd; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pfVar28->values)._begin = (pfVar27->values)._begin;
        pfVar27 = (features *)((long)pfVar27 + (ulong)bVar31 * -0x10 + 8);
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar31 * -0x10 + 8);
      }
      lVar25 = 100;
      pfVar27 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar28 = pfVar4;
      for (lVar26 = lVar25; lVar26 != 0; lVar26 = lVar26 + -1) {
        *(undefined1 *)&(pfVar28->values)._begin = *(undefined1 *)&(pfVar27->values)._begin;
        pfVar27 = (features *)((long)pfVar27 + (ulong)bVar31 * -2 + 1);
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar31 * -2 + 1);
      }
      ec_00->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           ec_00->total_sum_feat_sq;
      peVar36 = ec_00;
      LEARNER::learner<char,_example>::predict(base,ec_00,(ulong)n->k);
      (n->output_layer).partial_prediction = ec_00->partial_prediction;
      (n->output_layer).loss = ec_00->loss;
      ec_00->total_sum_feat_sq =
           ec_00->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pfVar27 = &save_nn_output_namespace;
      pfVar28 = pfVar4;
      for (; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined1 *)&(pfVar28->values)._begin = *(undefined1 *)&(pfVar27->values)._begin;
        pfVar27 = (features *)((long)pfVar27 + (ulong)bVar31 * -2 + 1);
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar31 * -2 + 1);
      }
      ppuVar1 = &(ec_00->super_example_predict).indices._end;
      *ppuVar1 = *ppuVar1 + -1;
      ec_00 = peVar36;
    }
    fVar35 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar35;
    if (0 < iVar39) {
      poVar24 = std::operator<<((ostream *)&outputStringStream,' ');
      std::ostream::operator<<(poVar24,(n->output_layer).partial_prediction);
      p_Var17 = n->all->print_text;
      iVar9 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar21._end = (char *)ec_00;
      vVar21._begin = (char *)in_stack_fffffffffffffc58;
      vVar21.end_array._0_4_ = fVar33;
      vVar21.end_array._4_4_ = fVar37;
      vVar21.erase_count._0_4_ = fVar38;
      vVar21.erase_count._4_4_ = iVar39;
      (*p_Var17)(iVar9,(string)ec->tag,vVar21);
      std::__cxx11::string::~string(local_310);
    }
    (ppVar2->simple).label = fVar6;
    if (bVar22 != 0) {
      fVar38 = n->prediction;
      fVar37 = (n->output_layer).partial_prediction;
      fVar33 = (n->output_layer).loss;
    }
    if ((bVar22 & n->dropout) != 1) break;
    for (uVar29 = 0; uVar29 < n->k; uVar29 = uVar29 + 1) {
      pbVar5 = pbVar13 + uVar29;
      *pbVar5 = (bool)(*pbVar5 ^ 1);
    }
    bVar22 = 0;
  }
  ec_00->partial_prediction = fVar37;
  (ec_00->pred).scalar = fVar38;
  ec_00->loss = fVar33;
  n->all->sd = psVar10;
  (*n->all->set_minmax)(n->all->sd,sd.min_label);
  (*n->all->set_minmax)(n->all->sd,sd.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}